

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupContextWindow(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  char *str;
  ImGuiContext *g;
  
  str = "window_context";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,str,(char *)0x0);
  pIVar1 = GImGui;
  if ((GImGui->IO).MouseReleased[popup_flags & 0x1fU] == true) {
    bVar2 = TestKeyOwner((popup_flags & 0x1fU) + ImGuiKey_MouseLeft,0);
    if (bVar2) {
      bVar2 = IsWindowHovered(0x20);
      if ((bVar2) &&
         ((((uint)popup_flags >> 8 & 1) == 0 ||
          ((pIVar1->HoveredId == 0 && (pIVar1->HoveredIdPreviousFrame == 0)))))) {
        OpenPopupEx(id,popup_flags);
      }
    }
  }
  bVar2 = BeginPopupEx(id,0x141);
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (!(popup_flags & ImGuiPopupFlags_NoOpenOverItems) || !IsAnyItemHovered())
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}